

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<8> __thiscall
embree::avx::GeneralBVHBuilder::
BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                        *current,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  Vec3fa VVar4;
  undefined4 uVar5;
  ThreadLocal2 *this_00;
  size_t i_1;
  long lVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar7;
  NodeRefPtr<8> NVar8;
  size_t sVar9;
  undefined8 *puVar10;
  ulong uVar11;
  unsigned_long *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t i_2;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  *this_01;
  char *pcVar17;
  bool bVar18;
  undefined1 auVar19 [32];
  ulong local_838;
  ThreadLocal2 *local_830;
  NodeRefPtr<4> values [16];
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_7a8;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  
  if ((this->cfg).maxDepth < current->depth) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)children,"depth limit reached",(allocator *)values);
    *puVar10 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar10 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar10 + 2),(string *)children);
    __cxa_throw(puVar10,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  if ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).maxLeafSize) {
    NVar8 = BVHBuilderBinnedFastSpatialSAH::
            CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>
            ::operator()((CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>
                          *)this->createLeaf,this->prims,
                         &(current->prims).super_extended_range<unsigned_long>.
                          super_range<unsigned_long>,alloc);
    return (NodeRefPtr<8>)NVar8.ptr;
  }
  this_01 = (BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
             *)children;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  ::operator=(this_01,current);
  uVar16 = 1;
  do {
    puVar12 = &children[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
    ;
    uVar11 = 0xffffffffffffffff;
    uVar13 = 0;
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      uVar15 = *puVar12 - ((range<unsigned_long> *)(puVar12 + -1))->_begin;
      if (((this->cfg).maxLeafSize < uVar15) && (uVar13 < uVar15)) {
        uVar11 = uVar14;
        uVar13 = uVar15;
      }
      puVar12 = puVar12 + 0xe;
    }
    if (uVar11 == 0xffffffffffffffff) break;
    values[0].ptr = current->depth + 1;
    values[1].ptr._0_1_ = 0;
    values[2].ptr._0_4_ = 0x7f800000;
    values[2].ptr._4_4_ = 0x7f800000;
    values[3].ptr._0_4_ = 0x7f800000;
    values[3].ptr._4_4_ = 0x7f800000;
    values[4].ptr._0_4_ = 0xff800000;
    values[4].ptr._4_4_ = 0xff800000;
    values[5].ptr._0_4_ = 0xff800000;
    values[5].ptr._4_4_ = 0xff800000;
    values[6].ptr._0_4_ = 0x7f800000;
    values[6].ptr._4_4_ = 0x7f800000;
    values[7].ptr._0_4_ = 0x7f800000;
    values[7].ptr._4_4_ = 0x7f800000;
    values[8].ptr._0_4_ = 0xff800000;
    values[8].ptr._4_4_ = 0xff800000;
    values[9].ptr._0_4_ = 0xff800000;
    values[9].ptr._4_4_ = 0xff800000;
    values[0xc].ptr = 0;
    values[10].ptr = 0;
    values[0xb].ptr = 0;
    local_7a8.alloc_barrier = false;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[0] = INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[1] = INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[2] = INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[3] = INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[0] = -INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[1] = -INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[2] = -INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[3] = -INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[0] = INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[1] = INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[2] = INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[3] = INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[0] = -INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[1] = -INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[2] = -INFINITY;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[3] = -INFINITY;
    local_7a8.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin = 0;
    local_7a8.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end = 0;
    local_7a8.prims.super_extended_range<unsigned_long>._ext_end = 0;
    local_7a8.depth = values[0].ptr;
    HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    splitFallback(this->heuristic,(PrimInfoExtRange *)&children[uVar11].prims,
                  (PrimInfoExtRange *)(values + 2),&local_7a8.prims);
    BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
    ::operator=((BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                 *)(children + uVar11),&local_7a8 + uVar16);
    BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
    ::operator=(&local_7a8 + uVar16,
                (BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                 *)values);
    BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
    ::operator=((BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                 *)(children + uVar16),&local_7a8);
    uVar16 = uVar16 + 1;
  } while (uVar16 < (this->cfg).branchingFactor);
  uVar11 = (this->cfg).primrefarrayalloc;
  if (uVar11 < (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end
               - (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _begin) {
    puVar12 = &children[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
    ;
    uVar13 = uVar16;
    while (bVar18 = uVar13 != 0, uVar13 = uVar13 - 1, bVar18) {
      *(bool *)(puVar12 + -10) =
           *puVar12 - ((range<unsigned_long> *)(puVar12 + -1))->_begin <= uVar11;
      puVar12 = puVar12 + 0xe;
    }
  }
  local_838 = 0x100;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_7a8.alloc_barrier = true;
    local_7a8.depth = (size_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar19 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_00->alloc0).end = auVar19._0_8_;
    (this_00->alloc0).allocBlockSize = auVar19._8_8_;
    (this_00->alloc0).bytesUsed = auVar19._16_8_;
    (this_00->alloc0).bytesWasted = auVar19._24_8_;
    (this_00->alloc0).ptr = (char *)auVar19._0_8_;
    (this_00->alloc0).cur = auVar19._8_8_;
    (this_00->alloc0).end = auVar19._16_8_;
    (this_00->alloc0).allocBlockSize = auVar19._24_8_;
    auVar19 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).end = auVar19._0_8_;
      (this_00->alloc1).allocBlockSize = auVar19._8_8_;
      (this_00->alloc1).bytesUsed = auVar19._16_8_;
      (this_00->alloc1).bytesWasted = auVar19._24_8_;
      (this_00->alloc1).ptr = (char *)auVar19._0_8_;
      (this_00->alloc1).cur = auVar19._8_8_;
      (this_00->alloc1).end = auVar19._16_8_;
      (this_00->alloc1).allocBlockSize = auVar19._24_8_;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)auVar19._0_8_;
      (this_00->alloc1).cur = auVar19._8_8_;
      (this_00->alloc1).end = auVar19._16_8_;
      (this_00->alloc1).allocBlockSize = auVar19._24_8_;
      (this_00->alloc1).end = auVar19._0_8_;
      (this_00->alloc1).allocBlockSize = auVar19._8_8_;
      (this_00->alloc1).bytesUsed = auVar19._16_8_;
      (this_00->alloc1).bytesWasted = auVar19._24_8_;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    values[0].ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
    values[1].ptr._0_1_ = 1;
    local_830 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,&local_830);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_7a8);
  }
  uVar11 = local_838;
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + local_838;
  sVar9 = (alloc.talloc0)->cur;
  uVar13 = (ulong)(-(int)sVar9 & 0x1f);
  uVar14 = sVar9 + local_838 + uVar13;
  (alloc.talloc0)->cur = uVar14;
  if ((alloc.talloc0)->end < uVar14) {
    (alloc.talloc0)->cur = sVar9;
    uVar13 = (alloc.talloc0)->allocBlockSize;
    if (local_838 * 4 < uVar13 || local_838 * 4 - uVar13 == 0) {
      values[0].ptr = uVar13;
      pcVar17 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)values);
      (alloc.talloc0)->ptr = pcVar17;
      sVar9 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar9;
      (alloc.talloc0)->end = values[0].ptr;
      (alloc.talloc0)->cur = uVar11;
      if (values[0].ptr < uVar11) {
        (alloc.talloc0)->cur = 0;
        values[0].ptr = (alloc.talloc0)->allocBlockSize;
        pcVar17 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)values);
        (alloc.talloc0)->ptr = pcVar17;
        sVar9 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar9;
        (alloc.talloc0)->end = values[0].ptr;
        (alloc.talloc0)->cur = uVar11;
        if (values[0].ptr < uVar11) {
          (alloc.talloc0)->cur = 0;
          pcVar17 = (char *)0x0;
          goto LAB_00c7efec;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar9;
    }
    else {
      pcVar17 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_838);
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar13;
    pcVar17 = (alloc.talloc0)->ptr + (uVar14 - local_838);
  }
LAB_00c7efec:
  pcVar17[0xc0] = '\0';
  pcVar17[0xc1] = '\0';
  pcVar17[0xc2] = -0x80;
  pcVar17[0xc3] = '\x7f';
  pcVar17[0xc4] = '\0';
  pcVar17[0xc5] = '\0';
  pcVar17[0xc6] = -0x80;
  pcVar17[199] = '\x7f';
  pcVar17[200] = '\0';
  pcVar17[0xc9] = '\0';
  pcVar17[0xca] = -0x80;
  pcVar17[0xcb] = '\x7f';
  pcVar17[0xcc] = '\0';
  pcVar17[0xcd] = '\0';
  pcVar17[0xce] = -0x80;
  pcVar17[0xcf] = '\x7f';
  pcVar17[0xd0] = '\0';
  pcVar17[0xd1] = '\0';
  pcVar17[0xd2] = -0x80;
  pcVar17[0xd3] = '\x7f';
  pcVar17[0xd4] = '\0';
  pcVar17[0xd5] = '\0';
  pcVar17[0xd6] = -0x80;
  pcVar17[0xd7] = '\x7f';
  pcVar17[0xd8] = '\0';
  pcVar17[0xd9] = '\0';
  pcVar17[0xda] = -0x80;
  pcVar17[0xdb] = '\x7f';
  pcVar17[0xdc] = '\0';
  pcVar17[0xdd] = '\0';
  pcVar17[0xde] = -0x80;
  pcVar17[0xdf] = '\x7f';
  pcVar17[0x80] = '\0';
  pcVar17[0x81] = '\0';
  pcVar17[0x82] = -0x80;
  pcVar17[0x83] = '\x7f';
  pcVar17[0x84] = '\0';
  pcVar17[0x85] = '\0';
  pcVar17[0x86] = -0x80;
  pcVar17[0x87] = '\x7f';
  pcVar17[0x88] = '\0';
  pcVar17[0x89] = '\0';
  pcVar17[0x8a] = -0x80;
  pcVar17[0x8b] = '\x7f';
  pcVar17[0x8c] = '\0';
  pcVar17[0x8d] = '\0';
  pcVar17[0x8e] = -0x80;
  pcVar17[0x8f] = '\x7f';
  pcVar17[0x90] = '\0';
  pcVar17[0x91] = '\0';
  pcVar17[0x92] = -0x80;
  pcVar17[0x93] = '\x7f';
  pcVar17[0x94] = '\0';
  pcVar17[0x95] = '\0';
  pcVar17[0x96] = -0x80;
  pcVar17[0x97] = '\x7f';
  pcVar17[0x98] = '\0';
  pcVar17[0x99] = '\0';
  pcVar17[0x9a] = -0x80;
  pcVar17[0x9b] = '\x7f';
  pcVar17[0x9c] = '\0';
  pcVar17[0x9d] = '\0';
  pcVar17[0x9e] = -0x80;
  pcVar17[0x9f] = '\x7f';
  pcVar17[0x40] = '\0';
  pcVar17[0x41] = '\0';
  pcVar17[0x42] = -0x80;
  pcVar17[0x43] = '\x7f';
  pcVar17[0x44] = '\0';
  pcVar17[0x45] = '\0';
  pcVar17[0x46] = -0x80;
  pcVar17[0x47] = '\x7f';
  pcVar17[0x48] = '\0';
  pcVar17[0x49] = '\0';
  pcVar17[0x4a] = -0x80;
  pcVar17[0x4b] = '\x7f';
  pcVar17[0x4c] = '\0';
  pcVar17[0x4d] = '\0';
  pcVar17[0x4e] = -0x80;
  pcVar17[0x4f] = '\x7f';
  pcVar17[0x50] = '\0';
  pcVar17[0x51] = '\0';
  pcVar17[0x52] = -0x80;
  pcVar17[0x53] = '\x7f';
  pcVar17[0x54] = '\0';
  pcVar17[0x55] = '\0';
  pcVar17[0x56] = -0x80;
  pcVar17[0x57] = '\x7f';
  pcVar17[0x58] = '\0';
  pcVar17[0x59] = '\0';
  pcVar17[0x5a] = -0x80;
  pcVar17[0x5b] = '\x7f';
  pcVar17[0x5c] = '\0';
  pcVar17[0x5d] = '\0';
  pcVar17[0x5e] = -0x80;
  pcVar17[0x5f] = '\x7f';
  pcVar17[0xe0] = '\0';
  pcVar17[0xe1] = '\0';
  pcVar17[0xe2] = -0x80;
  pcVar17[0xe3] = -1;
  pcVar17[0xe4] = '\0';
  pcVar17[0xe5] = '\0';
  pcVar17[0xe6] = -0x80;
  pcVar17[0xe7] = -1;
  pcVar17[0xe8] = '\0';
  pcVar17[0xe9] = '\0';
  pcVar17[0xea] = -0x80;
  pcVar17[0xeb] = -1;
  pcVar17[0xec] = '\0';
  pcVar17[0xed] = '\0';
  pcVar17[0xee] = -0x80;
  pcVar17[0xef] = -1;
  pcVar17[0xf0] = '\0';
  pcVar17[0xf1] = '\0';
  pcVar17[0xf2] = -0x80;
  pcVar17[0xf3] = -1;
  pcVar17[0xf4] = '\0';
  pcVar17[0xf5] = '\0';
  pcVar17[0xf6] = -0x80;
  pcVar17[0xf7] = -1;
  pcVar17[0xf8] = '\0';
  pcVar17[0xf9] = '\0';
  pcVar17[0xfa] = -0x80;
  pcVar17[0xfb] = -1;
  pcVar17[0xfc] = '\0';
  pcVar17[0xfd] = '\0';
  pcVar17[0xfe] = -0x80;
  pcVar17[0xff] = -1;
  pcVar17[0xa0] = '\0';
  pcVar17[0xa1] = '\0';
  pcVar17[0xa2] = -0x80;
  pcVar17[0xa3] = -1;
  pcVar17[0xa4] = '\0';
  pcVar17[0xa5] = '\0';
  pcVar17[0xa6] = -0x80;
  pcVar17[0xa7] = -1;
  pcVar17[0xa8] = '\0';
  pcVar17[0xa9] = '\0';
  pcVar17[0xaa] = -0x80;
  pcVar17[0xab] = -1;
  pcVar17[0xac] = '\0';
  pcVar17[0xad] = '\0';
  pcVar17[0xae] = -0x80;
  pcVar17[0xaf] = -1;
  pcVar17[0xb0] = '\0';
  pcVar17[0xb1] = '\0';
  pcVar17[0xb2] = -0x80;
  pcVar17[0xb3] = -1;
  pcVar17[0xb4] = '\0';
  pcVar17[0xb5] = '\0';
  pcVar17[0xb6] = -0x80;
  pcVar17[0xb7] = -1;
  pcVar17[0xb8] = '\0';
  pcVar17[0xb9] = '\0';
  pcVar17[0xba] = -0x80;
  pcVar17[0xbb] = -1;
  pcVar17[0xbc] = '\0';
  pcVar17[0xbd] = '\0';
  pcVar17[0xbe] = -0x80;
  pcVar17[0xbf] = -1;
  pcVar17[0x60] = '\0';
  pcVar17[0x61] = '\0';
  pcVar17[0x62] = -0x80;
  pcVar17[99] = -1;
  pcVar17[100] = '\0';
  pcVar17[0x65] = '\0';
  pcVar17[0x66] = -0x80;
  pcVar17[0x67] = -1;
  pcVar17[0x68] = '\0';
  pcVar17[0x69] = '\0';
  pcVar17[0x6a] = -0x80;
  pcVar17[0x6b] = -1;
  pcVar17[0x6c] = '\0';
  pcVar17[0x6d] = '\0';
  pcVar17[0x6e] = -0x80;
  pcVar17[0x6f] = -1;
  pcVar17[0x70] = '\0';
  pcVar17[0x71] = '\0';
  pcVar17[0x72] = -0x80;
  pcVar17[0x73] = -1;
  pcVar17[0x74] = '\0';
  pcVar17[0x75] = '\0';
  pcVar17[0x76] = -0x80;
  pcVar17[0x77] = -1;
  pcVar17[0x78] = '\0';
  pcVar17[0x79] = '\0';
  pcVar17[0x7a] = -0x80;
  pcVar17[0x7b] = -1;
  pcVar17[0x7c] = '\0';
  pcVar17[0x7d] = '\0';
  pcVar17[0x7e] = -0x80;
  pcVar17[0x7f] = -1;
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    pcVar2 = pcVar17 + lVar6 * 8;
    pcVar2[0] = '\b';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
  }
  paVar7 = &children[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
  for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
    auVar3 = *(undefined1 (*) [16])&paVar7[-1].field_1.x;
    VVar4.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar7->m128;
    *(int *)(pcVar17 + uVar11 * 4 + 0x40) = auVar3._0_4_;
    uVar5 = vextractps_avx(auVar3,1);
    *(undefined4 *)(pcVar17 + uVar11 * 4 + 0x80) = uVar5;
    uVar5 = vextractps_avx(auVar3,2);
    *(undefined4 *)(pcVar17 + uVar11 * 4 + 0xc0) = uVar5;
    *(int *)(pcVar17 + uVar11 * 4 + 0x60) = VVar4.field_0._0_4_;
    uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,1);
    *(undefined4 *)(pcVar17 + uVar11 * 4 + 0xa0) = uVar5;
    uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,2);
    *(undefined4 *)(pcVar17 + uVar11 * 4 + 0xe0) = uVar5;
    paVar7 = paVar7 + 7;
  }
  for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
    NVar8 = createLargeLeaf(this,this_01,alloc);
    values[uVar11].ptr = NVar8.ptr;
    this_01 = this_01 + 1;
  }
  for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
    *(size_t *)(pcVar17 + uVar11 * 8) = values[uVar11].ptr;
  }
  return (NodeRefPtr<8>)(size_t)pcVar17;
}

Assistant:

const ReductionTy createLargeLeaf(const BuildRecord& current, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (current.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* create leaf for few primitives */
            if (current.prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,current.prims))
              return createLeaf(prims,current.prims,alloc);

            /* fill all children by always splitting the largest one */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            size_t numChildren = 1;
            children[0] = current;
            do {

              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,children[i].prims))
                  continue;

                /* remember child with largest size */
                if (children[i].prims.size() > bestSize) {
                  bestSize = children[i].prims.size();
                  bestChild = i;
                }
              }
              if (bestChild == (size_t)-1) break;

              /*! split best child into left and right child */
              BuildRecord left(current.depth+1);
              BuildRecord right(current.depth+1);
              if (!canCreateLeaf(prims,children[bestChild].prims)) {
                canCreateLeafSplit(prims,children[bestChild].prims,left.prims,right.prims);
              } else {
                heuristic.splitFallback(children[bestChild].prims,left.prims,right.prims);
              }

              /* add new children left and right */
              children[bestChild] = children[numChildren-1];
              children[numChildren-1] = left;
              children[numChildren+0] = right;
              numChildren++;

            } while (numChildren < cfg.branchingFactor);

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* create node */
            auto node = createNode(children,numChildren,alloc);

            /* recurse into each child  and perform reduction */
            for (size_t i=0; i<numChildren; i++)
              values[i] = createLargeLeaf(children[i],alloc);

            /* perform reduction */
            return updateNode(current,children,node,values,numChildren);
          }